

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::truncate
          (ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *this,char *__file,
          __off_t __length)

{
  Embargo *pEVar1;
  Embargo *pEVar2;
  PromiseFulfiller<void> *pPVar3;
  Disposer *pDVar4;
  
  pEVar1 = this->ptr;
  pEVar2 = this->pos;
  while (pEVar1 + (long)__file < pEVar2) {
    this->pos = pEVar2 + -1;
    pPVar3 = pEVar2[-1].fulfiller.ptr.ptr;
    if (pPVar3 != (PromiseFulfiller<void> *)0x0) {
      pEVar2[-1].fulfiller.ptr.ptr = (PromiseFulfiller<void> *)0x0;
      pDVar4 = pEVar2[-1].fulfiller.ptr.disposer;
      (**pDVar4->_vptr_Disposer)
                (pDVar4,(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                        (long)&(pPVar3->super_PromiseRejector)._vptr_PromiseRejector);
    }
    pEVar2 = this->pos;
  }
  return (int)pEVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }